

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  vec<6U,_float> *this_00;
  vec<6U,_float> *this_01;
  long lVar5;
  VectorInfo *pVVar6;
  vec<6U,_float> *rhs;
  bool *pbVar7;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  float fVar8;
  float fVar9;
  double right_dist2;
  double left_dist2;
  vec<6U,_float> *v;
  uint i;
  uint end;
  uint begin;
  vec<6U,_float> *right_child;
  vec<6U,_float> *left_child;
  distance_comparison_task_params *pParams;
  uint local_3c;
  
  this_00 = (vec<6U,_float> *)*in_RDX;
  this_01 = (vec<6U,_float> *)in_RDX[1];
  iVar1 = *(int *)(in_RDX + 2);
  iVar2 = *(int *)((long)in_RDX + 0x14);
  iVar3 = *(int *)(in_RDX + 2);
  uVar4 = *(uint *)(in_RDX + 3);
  for (local_3c = *(int *)(in_RDX + 2) +
                  (int)(((ulong)(uint)(*(int *)((long)in_RDX + 0x14) - *(int *)(in_RDX + 2)) *
                        in_RSI) / (ulong)*(uint *)(in_RDX + 3));
      local_3c < (uint)(iVar1 + (int)(((ulong)(uint)(iVar2 - iVar3) * (in_RSI + 1)) / (ulong)uVar4))
      ; local_3c = local_3c + 1) {
    lVar5 = *in_RDI;
    pVVar6 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                       ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                        (in_RDI + 5),local_3c);
    rhs = (vec<6U,_float> *)(lVar5 + (ulong)pVVar6->index * 0x18);
    fVar8 = vec<6U,_float>::squared_distance(this_00,rhs);
    fVar9 = vec<6U,_float>::squared_distance(this_01,rhs);
    pbVar7 = vector<bool>::operator[]((vector<bool> *)(in_RDI + 0xb),local_3c);
    *pbVar7 = fVar8 < fVar9;
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr) {
    distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
    const VectorType& left_child = *pParams->left_child;
    const VectorType& right_child = *pParams->right_child;
    uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
    uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
    for (uint i = begin; i < end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      m_vectorComparison[i] = left_dist2 < right_dist2;
    }
  }